

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O3

void __thiscall Clasp::mt::ParallelSolve::allocThread(ParallelSolve *this,uint32 id,Solver *s)

{
  ulong __n;
  uint uVar1;
  ParallelHandler **__s;
  ParallelHandler *this_00;
  undefined4 in_register_00000034;
  size_t align;
  
  align = CONCAT44(in_register_00000034,id);
  if (this->thread_ == (ParallelHandler **)0x0) {
    uVar1 = (this->shared_->threads).super___atomic_base<unsigned_int>._M_i;
    __n = (ulong)uVar1 * 8;
    __s = (ParallelHandler **)operator_new__(__n);
    this->thread_ = __s;
    if (uVar1 != 0) {
      align = 0;
      memset(__s,0,__n);
    }
  }
  this_00 = (ParallelHandler *)alignedAllocChecked(0x80,align);
  MessageHandler::MessageHandler((MessageHandler *)this_00);
  (this_00->super_MessageHandler).super_PostPropagator.super_Constraint._vptr_Constraint =
       (_func_int **)&PTR_propagate_001e92a0;
  (this_00->thread_)._M_id._M_thread = 0;
  this_00->ctrl_ = this;
  this_00->solver_ = s;
  this_00->received_ = (RecBuffer)0x0;
  (this_00->integrated_).ebo_.buf = (pointer)0x0;
  (this_00->integrated_).ebo_.size = 0;
  (this_00->integrated_).ebo_.cap = 0;
  this_00->recEnd_ = 0;
  this_00->intEnd_ = 0;
  *(uint *)&this_00->field_0x58 = *(uint *)&this_00->field_0x58 & 0xc0000000;
  (this_00->super_MessageHandler).super_PostPropagator.next = (PostPropagator *)this_00;
  this->thread_[id] = this_00;
  return;
}

Assistant:

void ParallelSolve::allocThread(uint32 id, Solver& s) {
	if (!thread_) {
		uint32 n = numThreads();
		thread_  = new ParallelHandler*[n];
		std::fill(thread_, thread_+n, static_cast<ParallelHandler*>(0));
	}
	size_t sz   = ((sizeof(ParallelHandler)+63) / 64) * 64;
	thread_[id] = new (alignedAllocChecked(sz)) ParallelHandler(*this, s);
}